

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  ravi_type_map tt_00;
  int local_38;
  int idx;
  ravi_type_map tt;
  TString *usertype;
  int v;
  int base_local;
  expdesc *var_local;
  TString *n_local;
  FuncState *fs_local;
  
  usertype._4_4_ = base;
  _v = var;
  var_local = (expdesc *)n;
  n_local = (TString *)fs;
  if (fs == (FuncState *)0x0) {
    init_exp(var,VVOID,0,0xffffffff,(TString *)0x0);
  }
  else {
    usertype._0_4_ = searchvar(fs,n);
    if ((int)usertype < 0) {
      local_38 = searchupvalue((FuncState *)n_local,(TString *)var_local);
      if (local_38 < 0) {
        singlevaraux(*(FuncState **)&n_local->tt,(TString *)var_local,_v,0);
        if (_v->k == VVOID) {
          return;
        }
        local_38 = newupvalue((FuncState *)n_local,(TString *)var_local,_v);
      }
      init_exp(_v,VUPVAL,local_38,
               *(ravi_type_map *)(*(long *)&n_local->next[5].tt + (long)local_38 * 0x18 + 0x10),
               *(TString **)(*(long *)&n_local->next[5].tt + (long)local_38 * 0x18 + 8));
    }
    else {
      _idx = (TString *)0x0;
      tt_00 = raviY_get_register_typeinfo((FuncState *)n_local,(int)usertype,(TString **)&idx);
      init_exp(_v,VLOCAL,(int)usertype,tt_00,_idx);
      if (usertype._4_4_ == 0) {
        markupval((FuncState *)n_local,(int)usertype);
      }
    }
  }
  return;
}

Assistant:

static void singlevaraux (FuncState *fs, TString *n, expdesc *var, int base) {
  if (fs == NULL)  /* no more levels? */
    init_exp(var, VVOID, 0, RAVI_TM_ANY, NULL);  /* default is global */
  else {
    int v = searchvar(fs, n);  /* look up locals at current level */
    if (v >= 0) {  /* found? */
      /* RAVI set type of local var / expr if possible */
      TString *usertype = NULL;
      ravi_type_map tt = raviY_get_register_typeinfo(fs, v, &usertype);
      init_exp(var, VLOCAL, v, tt, usertype);  /* variable is local, RAVI set type */
      if (!base)
        markupval(fs, v);  /* local will be used as an upval */
    }
    else {  /* not found as local at current level; try upvalues */
      int idx = searchupvalue(fs, n);  /* try existing upvalues */
      if (idx < 0) {  /* not found? */
        singlevaraux(fs->prev, n, var, 0);  /* try upper levels */
        if (var->k == VVOID)  /* not found? */
          return;  /* it is a global */
        /* else was LOCAL or UPVAL */
        idx  = newupvalue(fs, n, var);  /* will be a new upvalue */
      }
      init_exp(var, VUPVAL, idx, fs->f->upvalues[idx].ravi_type_map, fs->f->upvalues[idx].usertype); /* RAVI : set upvalue type */
    }
  }
}